

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant.h
# Opt level: O2

int IsFlatSource16(uint8_t *src)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  uint32_t v;
  
  iVar2 = (uint)*src * 0x1010101;
  lVar3 = 0;
  while( true ) {
    if ((int)lVar3 == 0x200) {
      return 1;
    }
    piVar1 = (int *)(src + lVar3);
    if (*piVar1 != iVar2) {
      return 0;
    }
    if (piVar1[1] != iVar2) {
      return 0;
    }
    if (piVar1[2] != iVar2) break;
    if (piVar1[3] != iVar2) {
      return 0;
    }
    lVar3 = lVar3 + 0x20;
  }
  return 0;
}

Assistant:

static WEBP_INLINE int IsFlatSource16(const uint8_t* src) {
  const uint32_t v = src[0] * 0x01010101u;
  int i;
  for (i = 0; i < 16; ++i) {
    if (memcmp(src + 0, &v, 4) || memcmp(src +  4, &v, 4) ||
        memcmp(src + 8, &v, 4) || memcmp(src + 12, &v, 4)) {
      return 0;
    }
    src += BPS;
  }
  return 1;
}